

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          qpImageCompressionMode compression)

{
  float fVar1;
  bool bVar2;
  TextureFormat *pTVar3;
  float *pfVar4;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  undefined1 local_120 [8];
  Vec4 stencilBias;
  Vec4 stencilScale;
  Vec4 depthBias;
  Vec4 depthScale;
  ConstPixelBufferAccess stencilAccess;
  ConstPixelBufferAccess depthAccess;
  ConstPixelBufferAccess local_68;
  qpImageCompressionMode local_2c;
  ConstPixelBufferAccess *pCStack_28;
  qpImageCompressionMode compression_local;
  ConstPixelBufferAccess *access_local;
  string *description_local;
  string *name_local;
  LogImage *this_local;
  
  local_2c = compression;
  pCStack_28 = access;
  access_local = (ConstPixelBufferAccess *)description;
  description_local = name;
  name_local = &this->m_name;
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)access_local);
  ConstPixelBufferAccess::ConstPixelBufferAccess(&this->m_access,pCStack_28);
  Vector<float,_4>::Vector(&this->m_scale,1.0,1.0,1.0,1.0);
  Vector<float,_4>::Vector(&this->m_bias,0.0,0.0,0.0,0.0);
  this->m_compression = local_2c;
  pTVar3 = ConstPixelBufferAccess::getFormat(&this->m_access);
  bVar2 = isCombinedDepthStencilType(pTVar3->type);
  if (bVar2) {
    pTVar3 = ConstPixelBufferAccess::getFormat(&this->m_access);
    if (pTVar3->order == D) {
      getEffectiveDepthStencilAccess(&local_68,&this->m_access,MODE_DEPTH);
      memcpy(&this->m_access,&local_68,0x28);
    }
    else {
      pTVar3 = ConstPixelBufferAccess::getFormat(&this->m_access);
      if (pTVar3->order == S) {
        getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&depthAccess.m_data,&this->m_access,MODE_STENCIL);
        memcpy(&this->m_access,&depthAccess.m_data,0x28);
      }
    }
  }
  pTVar3 = ConstPixelBufferAccess::getFormat(&this->m_access);
  if (pTVar3->order == DS) {
    getEffectiveDepthStencilAccess
              ((ConstPixelBufferAccess *)&stencilAccess.m_data,&this->m_access,MODE_DEPTH);
    getEffectiveDepthStencilAccess
              ((ConstPixelBufferAccess *)(depthScale.m_data + 2),&this->m_access,MODE_STENCIL);
    Vector<float,_4>::Vector((Vector<float,_4> *)(depthBias.m_data + 2));
    Vector<float,_4>::Vector((Vector<float,_4> *)(stencilScale.m_data + 2));
    Vector<float,_4>::Vector((Vector<float,_4> *)(stencilBias.m_data + 2));
    Vector<float,_4>::Vector((Vector<float,_4> *)local_120);
    computePixelScaleBias
              ((ConstPixelBufferAccess *)&stencilAccess.m_data,(Vec4 *)(depthBias.m_data + 2),
               (Vec4 *)(stencilScale.m_data + 2));
    computePixelScaleBias
              ((ConstPixelBufferAccess *)(depthScale.m_data + 2),(Vec4 *)(stencilBias.m_data + 2),
               (Vec4 *)local_120);
    pfVar4 = Vector<float,_4>::x((Vector<float,_4> *)(depthBias.m_data + 2));
    fVar1 = *pfVar4;
    pfVar4 = Vector<float,_4>::x((Vector<float,_4> *)(stencilBias.m_data + 2));
    Vector<float,_4>::Vector(&local_130,fVar1,*pfVar4,0.0,0.0);
    *(undefined8 *)(this->m_scale).m_data = local_130.m_data._0_8_;
    *(undefined8 *)((this->m_scale).m_data + 2) = local_130.m_data._8_8_;
    pfVar4 = Vector<float,_4>::x((Vector<float,_4> *)(stencilScale.m_data + 2));
    fVar1 = *pfVar4;
    pfVar4 = Vector<float,_4>::x((Vector<float,_4> *)local_120);
    Vector<float,_4>::Vector(&local_140,fVar1,*pfVar4,0.0,0.0);
    *(undefined8 *)(this->m_bias).m_data = local_140.m_data._0_8_;
    *(undefined8 *)((this->m_bias).m_data + 2) = local_140.m_data._8_8_;
  }
  else {
    computePixelScaleBias(&this->m_access,&this->m_scale,&this->m_bias);
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
	// Simplify combined formats that only use a single channel
	if (tcu::isCombinedDepthStencilType(m_access.getFormat().type))
	{
		if (m_access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		else if (m_access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
	}

	// Implicit scale and bias
	if (m_access.getFormat().order != tcu::TextureFormat::DS)
		computePixelScaleBias(m_access, m_scale, m_bias);
	else
	{
		// Pack D and S bias and scale to R and G
		const ConstPixelBufferAccess	depthAccess		= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	stencilAccess	= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);
		tcu::Vec4						depthScale;
		tcu::Vec4						depthBias;
		tcu::Vec4						stencilScale;
		tcu::Vec4						stencilBias;

		computePixelScaleBias(depthAccess, depthScale, depthBias);
		computePixelScaleBias(stencilAccess, stencilScale, stencilBias);

		m_scale = tcu::Vec4(depthScale.x(), stencilScale.x(), 0.0f, 0.0f);
		m_bias = tcu::Vec4(depthBias.x(), stencilBias.x(), 0.0f, 0.0f);
	}
}